

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::methodHandle<float,float,float>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<float_(float,_float)> *method)

{
  function<float_(float,_float)> local_38;
  jsonrpccxx *local_18;
  function<float_(float,_float)> *method_local;
  
  local_18 = this;
  method_local = (function<float_(float,_float)> *)__return_storage_ptr__;
  std::function<float_(float,_float)>::function(&local_38,(function<float_(float,_float)> *)this);
  createMethodHandle<float,float,float,0ul,1ul>(__return_storage_ptr__,(jsonrpccxx *)&local_38);
  std::function<float_(float,_float)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }